

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstracttxin.cpp
# Opt level: O3

void __thiscall
AbstractTxIn_WitnessStackError_Test::TestBody(AbstractTxIn_WitnessStackError_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AbstractTxIn actual;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  ByteData local_108;
  AssertHelper local_f0;
  string local_e8;
  ScriptWitness local_c8;
  AbstractTxIn local_a8;
  
  cfd::core::AbstractTxIn::AbstractTxIn
            (&local_a8,&expect_txid,1,0xffffffff,&expect_unlocking_script);
  paVar1 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"0123456789","");
  cfd::core::ByteData::ByteData(&local_108,&local_e8);
  cfd::core::AbstractTxIn::SetScriptWitnessStack(&local_c8,&local_a8,0,&local_108);
  local_c8._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0067f138;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_c8.witness_stack_);
  if ((void *)CONCAT71(local_108.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._1_7_,
                       local_108.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_108.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_108.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = (internal)0x0;
  local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  testing::Message::Message((Message *)&local_110);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_e8,(internal *)&local_108,(AssertionResult *)0x4e8874,"false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_f0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstracttxin.cpp"
             ,0x77,local_e8._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_110);
  testing::internal::AssertHelper::~AssertHelper(&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (local_110.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_110.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_110.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_a8);
  return;
}

Assistant:

TEST(AbstractTxIn, WitnessStackError) {
  AbstractTxIn actual = AbstractTxIn(expect_txid, expect_index, expect_sequence,
                                     expect_unlocking_script);

  try {
    actual.SetScriptWitnessStack(0, ByteData("0123456789"));
  } catch (const CfdException &e) {
    EXPECT_STREQ(e.what(), "vin out_of_range error.");
    return;
  }
  ASSERT_TRUE(false);
}